

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweeper.c
# Opt level: O2

Gia_Man_t * Gia_SweeperCleanup(Gia_Man_t *p,char *pCommLime)

{
  Swp_Man_t *p_00;
  uint uVar1;
  int iVar2;
  int iLit1;
  Vec_Int_t *p_01;
  Gia_Obj_t *pGVar3;
  Gia_Man_t *pGVar4;
  char *pcVar5;
  Gia_Man_t *pNew;
  Abc_Frame_t *pAVar6;
  sat_solver *s;
  abctime aVar7;
  int iVar8;
  int unaff_R12D;
  int local_44;
  Gia_Man_t *local_40;
  char *local_38;
  
  p_00 = (Swp_Man_t *)p->pData;
  Gia_ManIncrementTravId(p);
  p_01 = Vec_IntAlloc(1000);
  local_44 = unaff_R12D;
  for (iVar8 = 0; iVar8 < p_00->vProbes->nSize; iVar8 = iVar8 + 1) {
    local_44 = Vec_IntEntry(p_00->vProbes,iVar8);
    if (-1 < local_44) {
      pGVar3 = Gia_Lit2Obj(p,local_44);
      Gia_ManExtract_rec(p,(Gia_Obj_t *)((ulong)pGVar3 & 0xfffffffffffffffe),p_01);
    }
  }
  local_38 = pCommLime;
  pGVar4 = Gia_ManStart((p->vCis->nSize - p->nRegs) + p_01->nSize + 0x65);
  pcVar5 = Abc_UtilStrsav(p->pName);
  pGVar4->pName = pcVar5;
  pcVar5 = Abc_UtilStrsav(p->pSpec);
  pGVar4->pSpec = pcVar5;
  p->pObjs->Value = 0;
  for (iVar8 = 0; iVar8 < p->vCis->nSize - p->nRegs; iVar8 = iVar8 + 1) {
    pGVar3 = Gia_ManCi(p,iVar8);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    uVar1 = Gia_ManAppendCi(pGVar4);
    pGVar3->Value = uVar1;
  }
  local_40 = pGVar4;
  Gia_ManHashStart(pGVar4);
  for (iVar8 = 0; iVar8 < p_01->nSize; iVar8 = iVar8 + 1) {
    iVar2 = Vec_IntEntry(p_01,iVar8);
    pGVar3 = Gia_ManObj(p,iVar2);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    iVar2 = Gia_ObjFanin0Copy(pGVar3);
    iLit1 = Gia_ObjFanin1Copy(pGVar3);
    uVar1 = Gia_ManHashAnd(local_40,iVar2,iLit1);
    pGVar3->Value = uVar1;
  }
  pGVar4 = local_40;
  Gia_ManHashStop(local_40);
  for (iVar8 = 0; iVar8 < p_00->vProbes->nSize; iVar8 = iVar8 + 1) {
    iVar2 = Vec_IntEntry(p_00->vProbes,iVar8);
    if (-1 < iVar2) {
      pGVar3 = Gia_Lit2Obj(p,iVar2);
      Vec_IntWriteEntry(p_00->vProbes,iVar8,
                        (uint)pGVar3 & 1 ^ *(uint *)(((ulong)pGVar3 & 0xfffffffffffffffe) + 8));
    }
  }
  Vec_IntFree(p_01);
  iVar8 = Gia_ManHasDangling(pGVar4);
  pNew = pGVar4;
  if (iVar8 != 0) {
    pNew = Gia_ManCleanup(pGVar4);
    Gia_ManStop(pGVar4);
  }
  pcVar5 = local_38;
  if (local_38 != (char *)0x0) {
    pAVar6 = Abc_FrameGetGlobalFrame();
    Abc_FrameUpdateGia(pAVar6,pNew);
    pAVar6 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar6,pcVar5);
    pAVar6 = Abc_FrameGetGlobalFrame();
    pNew = Abc_FrameGetGia(pAVar6);
  }
  p_00->vId2Lit->nSize = 0;
  sat_solver_delete(p_00->pSat);
  s = sat_solver_new();
  p_00->pSat = s;
  p_00->nSatVars = 1;
  sat_solver_setnvars(s,1000);
  iVar8 = p_00->nSatVars;
  p_00->nSatVars = iVar8 + 1;
  iVar8 = Abc_Var2Lit(iVar8,0);
  Swp_ManSetObj2Lit(p_00,0,iVar8);
  local_44 = Abc_LitNot(iVar8);
  sat_solver_addclause(p_00->pSat,&local_44,(lit *)&local_40);
  aVar7 = Abc_Clock();
  p_00->timeStart = aVar7;
  pNew->pData = p->pData;
  p->pData = (void *)0x0;
  Gia_ManStop(p);
  return pNew;
}

Assistant:

Gia_Man_t * Gia_SweeperCleanup( Gia_Man_t * p, char * pCommLime )
{
    Swp_Man_t * pSwp = (Swp_Man_t *)p->pData;
    Vec_Int_t * vObjIds;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, iLit, ProbeId;

    // collect all internal nodes pointed to by currently-used probes
    Gia_ManIncrementTravId( p );
    vObjIds = Vec_IntAlloc( 1000 );
    Vec_IntForEachEntry( pSwp->vProbes, iLit, ProbeId )
    {
        if ( iLit < 0 ) continue;
        pObj = Gia_Lit2Obj( p, iLit );
        Gia_ManExtract_rec( p, Gia_Regular(pObj), vObjIds );
    }
    // create new manager
    pNew = Gia_ManStart( 1 + Gia_ManPiNum(p) + Vec_IntSize(vObjIds) + 100 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    // create internal nodes
    Gia_ManHashStart( pNew );
    Gia_ManForEachObjVec( vObjIds, p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManHashStop( pNew );
    // create outputs
    Vec_IntForEachEntry( pSwp->vProbes, iLit, ProbeId )
    {
        if ( iLit < 0 ) continue;
        pObj = Gia_Lit2Obj( p, iLit );
        iLit = Gia_Regular(pObj)->Value ^ Gia_IsComplement(pObj);
        Vec_IntWriteEntry( pSwp->vProbes, ProbeId, iLit );
    }
    Vec_IntFree( vObjIds );
    // duplicate if needed
    if ( Gia_ManHasDangling(pNew) )
    {
        pNew = Gia_ManCleanup( pTemp = pNew );
        Gia_ManStop( pTemp );
    }
    // execute command line
    if ( pCommLime )
    {
        // set pNew to be current GIA in ABC
        Abc_FrameUpdateGia( Abc_FrameGetGlobalFrame(), pNew );
        // execute command line pCommLine using Abc_CmdCommandExecute()
        Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), pCommLime );
        // get pNew to be current GIA in ABC     
        pNew = Abc_FrameGetGia( Abc_FrameGetGlobalFrame() );
    }
    // restart the SAT solver
    Vec_IntClear( pSwp->vId2Lit );
    sat_solver_delete( pSwp->pSat );
    pSwp->pSat         = sat_solver_new();
    pSwp->nSatVars     = 1;
    sat_solver_setnvars( pSwp->pSat, 1000 );
    Swp_ManSetObj2Lit( pSwp, 0, (iLit = Abc_Var2Lit(pSwp->nSatVars++, 0)) );
    iLit = Abc_LitNot(iLit);
    sat_solver_addclause( pSwp->pSat, &iLit, &iLit + 1 );
    pSwp->timeStart    = Abc_Clock();
    // return the result
    pNew->pData = p->pData; p->pData = NULL;
    Gia_ManStop( p );
    return pNew;
}